

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::SplitBailOnImplicitCall(Lowerer *this,Instr **instr)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  int iVar4;
  undefined4 *puVar5;
  IntConstOpnd *opnd;
  ThreadContextInfo *pTVar6;
  undefined4 extraout_var;
  Opnd *dstOpnd;
  IntConstOpnd *pIVar7;
  Instr *pIVar8;
  Instr *bailOutInstr;
  Opnd *disableImplicitCallAddress;
  Instr *enableImplicitCallsInstr;
  Instr *disableImplicitCallsInstr;
  AutoReuseOpnd autoReuseNoImplicitCall;
  IntConstOpnd *noImplicitCall;
  AutoReuseOpnd autoReuseImplicitCallFlags;
  Opnd *implicitCallFlags;
  BailOutKind bailOutKind;
  Instr **instr_local;
  Lowerer *this_local;
  
  bVar2 = IR::Instr::IsPlainInstr(*instr);
  if (!bVar2) {
    bVar2 = IR::Instr::IsProfiledInstr(*instr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x360f,"(instr->IsPlainInstr() || instr->IsProfiledInstr())",
                         "instr->IsPlainInstr() || instr->IsProfiledInstr()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  BVar3 = IR::Instr::GetBailOutKind(*instr);
  bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3612,"(BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))",
                       "BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  autoReuseImplicitCallFlags._16_8_ = GetImplicitCallFlagsOpnd(this);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&noImplicitCall,(Opnd *)autoReuseImplicitCallFlags._16_8_,
             (*instr)->m_func,true);
  opnd = IR::IntConstOpnd::New(1,TyInt8,this->m_func,true);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&disableImplicitCallsInstr,&opnd->super_Opnd,(*instr)->m_func,true);
  InsertMove((Opnd *)autoReuseImplicitCallFlags._16_8_,&opnd->super_Opnd,*instr,true);
  enableImplicitCallsInstr = (Instr *)0x0;
  disableImplicitCallAddress = (Opnd *)0x0;
  BVar3 = BailOutInfo::WithoutLazyBailOut(BVar3);
  if (BVar3 == BailOutOnImplicitCallsPreOp) {
    pTVar6 = Func::GetThreadContextInfo((*instr)->m_func);
    iVar4 = (*pTVar6->_vptr_ThreadContextInfo[4])();
    dstOpnd = LowererMD::GenerateMemRef
                        (&this->m_lowererMD,CONCAT44(extraout_var,iVar4),TyInt8,*instr,false);
    pIVar7 = IR::IntConstOpnd::New(1,TyInt8,(*instr)->m_func,true);
    enableImplicitCallsInstr = IR::Instr::New(Ld_A,dstOpnd,&pIVar7->super_Opnd,(*instr)->m_func);
    IR::Instr::InsertBefore(*instr,enableImplicitCallsInstr);
    pIVar7 = IR::IntConstOpnd::New(0,TyInt8,(*instr)->m_func,true);
    disableImplicitCallAddress =
         (Opnd *)IR::Instr::New(Ld_A,dstOpnd,&pIVar7->super_Opnd,(*instr)->m_func);
    ((Instr *)disableImplicitCallAddress)->m_noLazyHelperAssert = true;
  }
  this_00 = *instr;
  pIVar8 = IR::Instr::New((*instr)->m_opcode,(*instr)->m_func);
  *instr = pIVar8;
  IR::Instr::TransferTo(this_00,*instr);
  IR::Instr::InsertBefore(this_00,*instr);
  if (enableImplicitCallsInstr != (Instr *)0x0) {
    if (disableImplicitCallAddress == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3644,"(enableImplicitCallsInstr)","enableImplicitCallsInstr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    IR::Instr::InsertBefore(this_00,(Instr *)disableImplicitCallAddress);
    LowererMD::ChangeToAssign(enableImplicitCallsInstr);
    LowererMD::ChangeToAssign((Instr *)disableImplicitCallAddress);
  }
  this_00->m_opcode = BailOnNotEqual;
  IR::Instr::SetSrc1(this_00,(Opnd *)autoReuseImplicitCallFlags._16_8_);
  IR::Instr::SetSrc2(this_00,&opnd->super_Opnd);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&disableImplicitCallsInstr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&noImplicitCall);
  return this_00;
}

Assistant:

IR::Instr *
Lowerer::SplitBailOnImplicitCall(IR::Instr *& instr)
{
    Assert(instr->IsPlainInstr() || instr->IsProfiledInstr());

    const auto bailOutKind = instr->GetBailOutKind();
    Assert(BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind));

    IR::Opnd * implicitCallFlags = this->GetImplicitCallFlagsOpnd();
    const IR::AutoReuseOpnd autoReuseImplicitCallFlags(implicitCallFlags, instr->m_func);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, this->m_func, true);
    const IR::AutoReuseOpnd autoReuseNoImplicitCall(noImplicitCall, instr->m_func);

    // Reset the implicit call flag on every helper call
    Lowerer::InsertMove(implicitCallFlags, noImplicitCall, instr);

    IR::Instr *disableImplicitCallsInstr = nullptr, *enableImplicitCallsInstr = nullptr;
    if(BailOutInfo::WithoutLazyBailOut(bailOutKind) == IR::BailOutOnImplicitCallsPreOp)
    {
        const auto disableImplicitCallAddress =
            m_lowererMD.GenerateMemRef(
                instr->m_func->GetThreadContextInfo()->GetDisableImplicitFlagsAddr(),
                TyInt8,
                instr);

        // Disable implicit calls since they will be called after bailing out
        disableImplicitCallsInstr =
            IR::Instr::New(
                Js::OpCode::Ld_A,
                disableImplicitCallAddress,
                IR::IntConstOpnd::New(DisableImplicitCallFlag, TyInt8, instr->m_func, true),
                instr->m_func);
        instr->InsertBefore(disableImplicitCallsInstr);

        // Create instruction for re-enabling implicit calls
        enableImplicitCallsInstr =
            IR::Instr::New(
                Js::OpCode::Ld_A,
                disableImplicitCallAddress,
                IR::IntConstOpnd::New(DisableImplicitNoFlag, TyInt8, instr->m_func, true),
                instr->m_func);

#if DBG
        enableImplicitCallsInstr->m_noLazyHelperAssert = true;
#endif
    }

    IR::Instr * bailOutInstr = instr;

    instr = IR::Instr::New(instr->m_opcode, instr->m_func);
    bailOutInstr->TransferTo(instr);
    bailOutInstr->InsertBefore(instr);

    if(disableImplicitCallsInstr)
    {
        // Re-enable implicit calls
        Assert(enableImplicitCallsInstr);
        bailOutInstr->InsertBefore(enableImplicitCallsInstr);

        // Lower both instructions. Lowering an instruction may free the instruction's original operands, so do that last.
        LowererMD::ChangeToAssign(disableImplicitCallsInstr);
        LowererMD::ChangeToAssign(enableImplicitCallsInstr);
    }

    bailOutInstr->m_opcode = Js::OpCode::BailOnNotEqual;

    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);

    return bailOutInstr;
}